

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArraySamplingTest::vertexArrayObjectDefinition::~vertexArrayObjectDefinition
          (vertexArrayObjectDefinition *this)

{
  if (this->m_vertex_array_object_id != 0xffffffff) {
    if (this->m_gl != (Functions *)0x0) {
      (*this->m_gl->deleteVertexArrays)(1,&this->m_vertex_array_object_id);
      this->m_gl = (Functions *)0x0;
    }
    this->m_vertex_array_object_id = 0xffffffff;
  }
  return;
}

Assistant:

TextureCubeMapArraySamplingTest::vertexArrayObjectDefinition::~vertexArrayObjectDefinition()
{
	if (m_invalid_vertex_array_object_id != m_vertex_array_object_id)
	{
		if (0 != m_gl)
		{
			m_gl->deleteVertexArrays(1, &m_vertex_array_object_id);

			m_gl = 0;
		}

		m_vertex_array_object_id = m_invalid_vertex_array_object_id;
	}
}